

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void ResortStates(lemon *lemp)

{
  state *psVar1;
  int iVar2;
  bool bVar3;
  action *paStack_28;
  int iAction;
  action *ap;
  state *stp;
  int i;
  lemon *lemp_local;
  
  stp._4_4_ = 0;
  do {
    if (lemp->nstate <= stp._4_4_) {
      qsort(lemp->sorted + 1,(long)(lemp->nstate + -1),8,stateResortCompare);
      for (stp._4_4_ = 0; stp._4_4_ < lemp->nstate; stp._4_4_ = stp._4_4_ + 1) {
        lemp->sorted[stp._4_4_]->statenum = stp._4_4_;
      }
      lemp->nxstate = lemp->nstate;
      while( true ) {
        bVar3 = false;
        if (1 < lemp->nxstate) {
          bVar3 = lemp->sorted[lemp->nxstate + -1]->autoReduce != 0;
        }
        if (!bVar3) break;
        lemp->nxstate = lemp->nxstate + -1;
      }
      return;
    }
    psVar1 = lemp->sorted[stp._4_4_];
    psVar1->nNtAct = 0;
    psVar1->nTknAct = 0;
    psVar1->iDfltReduce = lemp->nrule;
    psVar1->iTknOfst = -0x7fffffff;
    psVar1->iNtOfst = -0x7fffffff;
    for (paStack_28 = psVar1->ap; paStack_28 != (action *)0x0; paStack_28 = paStack_28->next) {
      iVar2 = compute_action(lemp,paStack_28);
      if (-1 < iVar2) {
        if (paStack_28->sp->index < lemp->nterminal) {
          psVar1->nTknAct = psVar1->nTknAct + 1;
        }
        else if (paStack_28->sp->index < lemp->nsymbol) {
          psVar1->nNtAct = psVar1->nNtAct + 1;
        }
        else {
          if ((psVar1->autoReduce != 0) && (psVar1->pDfltReduce != (rule *)(paStack_28->x).stp)) {
            __assert_fail("stp->autoReduce==0 || stp->pDfltReduce==ap->x.rp",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                          ,0x1264,"void ResortStates(struct lemon *)");
          }
          psVar1->iDfltReduce = (iVar2 - lemp->nstate) - lemp->nrule;
        }
      }
    }
    stp._4_4_ = stp._4_4_ + 1;
  } while( true );
}

Assistant:

void ResortStates(struct lemon *lemp)
{
  int i;
  struct state *stp;
  struct action *ap;

  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    stp->nTknAct = stp->nNtAct = 0;
    stp->iDfltReduce = lemp->nrule;  /* Init dflt action to "syntax error" */
    stp->iTknOfst = NO_OFFSET;
    stp->iNtOfst = NO_OFFSET;
    for(ap=stp->ap; ap; ap=ap->next){
      int iAction = compute_action(lemp,ap);
      if( iAction>=0 ){
        if( ap->sp->index<lemp->nterminal ){
          stp->nTknAct++;
        }else if( ap->sp->index<lemp->nsymbol ){
          stp->nNtAct++;
        }else{
          assert( stp->autoReduce==0 || stp->pDfltReduce==ap->x.rp );
          stp->iDfltReduce = iAction - lemp->nstate - lemp->nrule;
        }
      }
    }
  }
  qsort(&lemp->sorted[1], lemp->nstate-1, sizeof(lemp->sorted[0]),
        stateResortCompare);
  for(i=0; i<lemp->nstate; i++){
    lemp->sorted[i]->statenum = i;
  }
  lemp->nxstate = lemp->nstate;
  while( lemp->nxstate>1 && lemp->sorted[lemp->nxstate-1]->autoReduce ){
    lemp->nxstate--;
  }
}